

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview_p.h
# Opt level: O3

QList<int> * __thiscall
QListViewPrivate::hiddenRowIds(QList<int> *__return_storage_ptr__,QListViewPrivate *this)

{
  ulong uVar1;
  size_t asize;
  ulong uVar2;
  Data *pDVar3;
  long in_FS_OFFSET;
  int local_2c;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (int *)0x0;
  (__return_storage_ptr__->d).size = 0;
  pDVar3 = (this->hiddenRows).q_hash.d;
  if (pDVar3 == (Data *)0x0) {
    asize = 0;
  }
  else {
    asize = pDVar3->size;
  }
  QList<int>::reserve(__return_storage_ptr__,asize);
  pDVar3 = (this->hiddenRows).q_hash.d;
  if (pDVar3 == (Data *)0x0) {
    pDVar3 = (Data *)0x0;
    uVar2 = 0;
LAB_005756ed:
    if (pDVar3 == (Data *)0x0 && uVar2 == 0) goto LAB_00575792;
  }
  else {
    if (pDVar3->spans->offsets[0] == 0xff) {
      uVar1 = 1;
      do {
        uVar2 = uVar1;
        if (pDVar3->numBuckets == uVar2) {
          pDVar3 = (Data *)0x0;
          uVar2 = 0;
          break;
        }
        uVar1 = uVar2 + 1;
      } while (pDVar3->spans[uVar2 >> 7].offsets[(uint)uVar2 & 0x7f] == 0xff);
      goto LAB_005756ed;
    }
    uVar2 = 0;
  }
  do {
    local_2c = QPersistentModelIndex::row();
    QtPrivate::QPodArrayOps<int>::emplace<int&>
              ((QPodArrayOps<int> *)__return_storage_ptr__,(__return_storage_ptr__->d).size,
               &local_2c);
    QList<int>::end(__return_storage_ptr__);
    do {
      if (pDVar3->numBuckets - 1 == uVar2) {
        pDVar3 = (Data *)0x0;
        uVar2 = 0;
        break;
      }
      uVar2 = uVar2 + 1;
    } while (pDVar3->spans[uVar2 >> 7].offsets[(uint)uVar2 & 0x7f] == 0xff);
  } while ((pDVar3 != (Data *)0x0) || (uVar2 != 0));
LAB_00575792:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QList<int> hiddenRowIds() const
    {
        QList<int> rowIds;
        rowIds.reserve(hiddenRows.size());
        for (const auto &idx : hiddenRows)
            rowIds += idx.row();
        return rowIds;
    }